

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elf_mem_image.cc
# Opt level: O1

void __thiscall
absl::lts_20250127::debugging_internal::ElfMemImage::SymbolIterator::Update
          (SymbolIterator *this,uint32_t increment)

{
  char cVar1;
  byte bVar2;
  Elf64_Word offset;
  ElfMemImage *this_00;
  long lVar3;
  bool bVar4;
  Elf64_Sym *sym;
  Elf64_Versym *pEVar5;
  char *pcVar6;
  Elf64_Verdef *pEVar7;
  char *pcVar8;
  void *pvVar9;
  size_t out_size;
  long lVar10;
  long lVar11;
  uint32_t index;
  undefined4 in_register_00000034;
  ElfMemImage *mangled;
  State SStack_58;
  
  pcVar8 = (char *)CONCAT44(in_register_00000034,increment);
  this_00 = (ElfMemImage *)this->image_;
  if (increment == 0 || this_00->ehdr_ != (Elf64_Ehdr *)0x0) {
    if (this_00->ehdr_ == (Elf64_Ehdr *)0x0) {
      return;
    }
    index = increment + this->index_;
    this->index_ = index;
    if (this_00->num_syms_ <= index) {
      this->index_ = this_00->num_syms_;
      return;
    }
    SStack_58.parse_state._12_4_ = 0x2641e7;
    SStack_58._44_4_ = 0;
    sym = GetDynsym(this_00,index);
    pcVar8 = (char *)(ulong)this->index_;
    SStack_58.parse_state._12_4_ = 0x2641f5;
    SStack_58._44_4_ = 0;
    mangled = this_00;
    pEVar5 = GetVersym(this_00,this->index_);
    if ((sym != (Elf64_Sym *)0x0) && (pEVar5 != (Elf64_Versym *)0x0)) {
      pcVar8 = (char *)(ulong)sym->st_name;
      SStack_58.parse_state._12_4_ = 0x264215;
      SStack_58._44_4_ = 0;
      mangled = this_00;
      pcVar6 = GetDynstr(this_00,sym->st_name);
      if (sym->st_shndx == 0) {
        pEVar7 = (Elf64_Verdef *)0x0;
      }
      else {
        pcVar8 = (char *)(ulong)(*pEVar5 & 0x7fff);
        SStack_58.parse_state._12_4_ = 0x264233;
        SStack_58._44_4_ = 0;
        mangled = this_00;
        pEVar7 = GetVerdef(this_00,*pEVar5 & 0x7fff);
      }
      if (pEVar7 == (Elf64_Verdef *)0x0) {
        pcVar8 = "";
LAB_00264262:
        (this->info_).name = pcVar6;
        (this->info_).version = pcVar8;
        SStack_58.parse_state._12_4_ = 0x264274;
        SStack_58._44_4_ = 0;
        pvVar9 = GetSymAddr(this_00,sym);
        (this->info_).address = pvVar9;
        (this->info_).symbol = sym;
        return;
      }
      if (0xfffd < (ushort)(pEVar7->vd_cnt - 3)) {
        offset._0_2_ = pEVar7[1].vd_version;
        offset._2_2_ = pEVar7[1].vd_flags;
        SStack_58.parse_state._12_4_ = 0x264259;
        SStack_58._44_4_ = 0;
        pcVar8 = GetVerstr(this_00,offset);
        goto LAB_00264262;
      }
      goto LAB_00264290;
    }
  }
  else {
    SStack_58.parse_state._12_4_ = 0x26428b;
    SStack_58._44_4_ = 0;
    Update();
    mangled = (ElfMemImage *)this;
  }
  SStack_58.parse_state._12_4_ = 0x264290;
  SStack_58._44_4_ = 0;
  Update();
LAB_00264290:
  SStack_58.parse_state._12_4_ = 0x264295;
  SStack_58._44_4_ = 0;
  Update();
  if ((*(char *)&mangled->ehdr_ == '_') && (*(char *)((long)&mangled->ehdr_ + 1) == 'R')) {
    DemangleRustSymbolEncoding((char *)mangled,pcVar8,out_size);
    return;
  }
  SStack_58.out_end_idx = (int)out_size;
  SStack_58.parse_state.mangled_idx = 0;
  SStack_58.parse_state.out_cur_idx = 0;
  SStack_58.parse_state.prev_name_idx = 0;
  SStack_58.parse_state._12_4_ = 0xffff0000;
  SStack_58.recursion_depth = 1;
  SStack_58.steps = 1;
  SStack_58.mangled_begin = (char *)mangled;
  SStack_58.out = pcVar8;
  bVar4 = ParseMangledName(&SStack_58);
  if (bVar4) {
    lVar10 = (long)SStack_58.parse_state.mangled_idx;
    cVar1 = *(char *)((long)(Elf64_Ehdr **)SStack_58.mangled_begin + lVar10);
    if (cVar1 != '\0') {
      pcVar8 = (char *)((long)(Elf64_Ehdr **)SStack_58.mangled_begin + lVar10);
      lVar11 = 0;
      do {
        if (pcVar8[lVar11] == '.') {
          if ((pcVar8[lVar11 + 1] != 0x5f) && (0x19 < (byte)((pcVar8[lVar11 + 1] & 0xdfU) + 0xbf)))
          goto LAB_0026434f;
          lVar11 = lVar11 + 1;
          do {
            do {
              bVar2 = *(byte *)((long)(Elf64_Ehdr **)SStack_58.mangled_begin + lVar11 + lVar10 + 1);
              lVar11 = lVar11 + 1;
            } while (bVar2 == 0x5f);
          } while ((byte)((bVar2 & 0xdf) + 0xbf) < 0x1a);
          bVar4 = true;
        }
        else {
          if (pcVar8[lVar11] == '\0') {
            return;
          }
LAB_0026434f:
          bVar4 = false;
        }
        if ((pcVar8[lVar11] == '.') && ((byte)(pcVar8[lVar11 + 1] - 0x30U) < 10)) {
          lVar11 = lVar11 + 1;
          do {
            lVar3 = lVar11 + lVar10 + 1;
            lVar11 = lVar11 + 1;
          } while ((byte)(*(char *)((long)(Elf64_Ehdr **)SStack_58.mangled_begin + lVar3) - 0x30U) <
                   10);
          bVar4 = true;
        }
      } while (bVar4);
      if (cVar1 == '@') {
        MaybeAppend(&SStack_58,pcVar8);
      }
    }
  }
  return;
}

Assistant:

void ElfMemImage::SymbolIterator::Update(uint32_t increment) {
  const ElfMemImage *image = reinterpret_cast<const ElfMemImage *>(image_);
  ABSL_RAW_CHECK(image->IsPresent() || increment == 0, "");
  if (!image->IsPresent()) {
    return;
  }
  index_ += increment;
  if (index_ >= image->GetNumSymbols()) {
    index_ = image->GetNumSymbols();
    return;
  }
  const ElfW(Sym)    *symbol = image->GetDynsym(index_);
  const ElfW(Versym) *version_symbol = image->GetVersym(index_);
  ABSL_RAW_CHECK(symbol && version_symbol, "");
  const char *const symbol_name = image->GetDynstr(symbol->st_name);
#if defined(__NetBSD__)
  const int version_index = version_symbol->vs_vers & VERSYM_VERSION;
#else
  const ElfW(Versym) version_index = version_symbol[0] & VERSYM_VERSION;
#endif
  const ElfW(Verdef) *version_definition = nullptr;
  const char *version_name = "";
  if (symbol->st_shndx == SHN_UNDEF) {
    // Undefined symbols reference DT_VERNEED, not DT_VERDEF, and
    // version_index could well be greater than verdefnum_, so calling
    // GetVerdef(version_index) may trigger assertion.
  } else {
    version_definition = image->GetVerdef(version_index);
  }
  if (version_definition) {
    // I am expecting 1 or 2 auxiliary entries: 1 for the version itself,
    // optional 2nd if the version has a parent.
    ABSL_RAW_CHECK(
        version_definition->vd_cnt == 1 || version_definition->vd_cnt == 2,
        "wrong number of entries");
    const ElfW(Verdaux) *version_aux = image->GetVerdefAux(version_definition);
    version_name = image->GetVerstr(version_aux->vda_name);
  }
  info_.name    = symbol_name;
  info_.version = version_name;
  info_.address = image->GetSymAddr(symbol);
  info_.symbol  = symbol;
}